

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_loop.c
# Opt level: O3

int lj_opt_loop(jit_State *J)

{
  uint16_t *puVar1;
  ushort uVar2;
  IRRef ins;
  MSize nsnapmap;
  int iVar3;
  lua_State *L;
  TValue *pTVar4;
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar5;
  int errcode;
  LoopState lps;
  jit_State *local_48;
  undefined8 local_40;
  uint local_38;
  
  ins = (J->cur).nins;
  nsnapmap = (J->cur).nsnapmap;
  uVar2 = (J->cur).nsnap;
  local_40 = 0;
  local_38 = 0;
  local_48 = J;
  errcode = lj_vm_cpcall(J->L,0,&local_48,cploop_opt);
  puVar1 = &J[-1].penalty[0x25].val;
  *(ulong *)puVar1 = *(long *)puVar1 + (ulong)local_38 * -2;
  (**(code **)&J[-1].penalty[0x24].val)(J[-1].penalty[0x25].pc.ptr64,local_40,(ulong)local_38 * 2,0)
  ;
  if (errcode == 0) {
    return 0;
  }
  L = J->L;
  if (errcode == 2) {
    pTVar4 = L->top;
    aVar5 = pTVar4[-1].field_4;
    if (((aVar5.it >> 0xf < 0x1fff3) && (((int)(double)aVar5 | 2U) == 0x1a)) &&
       (iVar3 = J->instunroll, J->instunroll = iVar3 + -1, 0 < iVar3)) {
      L->top = pTVar4 + -1;
      loop_undo(J,ins,(uint)uVar2,nsnapmap);
      return 1;
    }
  }
  lj_err_throw(L,errcode);
}

Assistant:

int lj_opt_loop(jit_State *J)
{
  IRRef nins = J->cur.nins;
  SnapNo nsnap = J->cur.nsnap;
  MSize nsnapmap = J->cur.nsnapmap;
  LoopState lps;
  int errcode;
  lps.J = J;
  lps.subst = NULL;
  lps.sizesubst = 0;
  errcode = lj_vm_cpcall(J->L, NULL, &lps, cploop_opt);
  lj_mem_freevec(J2G(J), lps.subst, lps.sizesubst, IRRef1);
  if (LJ_UNLIKELY(errcode)) {
    lua_State *L = J->L;
    if (errcode == LUA_ERRRUN && tvisnumber(L->top-1)) {  /* Trace error? */
      int32_t e = numberVint(L->top-1);
      switch ((TraceError)e) {
      case LJ_TRERR_TYPEINS:  /* Type instability. */
      case LJ_TRERR_GFAIL:  /* Guard would always fail. */
	/* Unrolling via recording fixes many cases, e.g. a flipped boolean. */
	if (--J->instunroll < 0)  /* But do not unroll forever. */
	  break;
	L->top--;  /* Remove error object. */
	loop_undo(J, nins, nsnap, nsnapmap);
	return 1;  /* Loop optimization failed, continue recording. */
      default:
	break;
      }
    }
    lj_err_throw(L, errcode);  /* Propagate all other errors. */
  }
  return 0;  /* Loop optimization is ok. */
}